

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloat.hpp
# Opt level: O3

Float<unsigned_short,_5,_10,_15,_1U>
tcu::Float<unsigned_short,5,10,15,1u>::convert<unsigned_int,8,23,127,3u>
          (Float<unsigned_int,_8,_23,_127,_3U> *other)

{
  uint uVar1;
  long lVar2;
  ushort uVar3;
  uint uVar4;
  ushort uVar5;
  int iVar6;
  uint uVar7;
  
  uVar1 = other->m_value;
  if ((uVar1 & 0x7fffffff) != 0x7f800000) {
    uVar4 = uVar1 & 0x7fffff;
    if ((uVar1 & 0x7f800000) == 0x7f800000 && uVar4 != 0) {
      return (Float<unsigned_short,_5,_10,_15,_1U>)0x7fff;
    }
    uVar3 = (ushort)(uVar1 >> 0x10);
    if ((uVar1 & 0x7fffffff) == 0) {
      return (Float<unsigned_short,_5,_10,_15,_1U>)uVar3;
    }
    uVar7 = uVar4 + 0x800000;
    if ((uVar1 & 0x7f800000) == 0 && uVar4 != 0) {
      lVar2 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      uVar7 = uVar4 << (~(byte)lVar2 + 0x18 & 0x3f);
      iVar6 = ((uint)lVar2 ^ 0xffffffc0) - 0x55;
    }
    else {
      iVar6 = (uVar1 >> 0x17 & 0xff) - 0x7f;
    }
    uVar3 = uVar3 & 0x8000;
    if (iVar6 < -0xe) {
      return (Float<unsigned_short,_5,_10,_15,_1U>)uVar3;
    }
    uVar4 = (uVar7 & 0xff7fffff) + 0xfff + (uint)((uVar7 >> 0xd & 1) != 0);
    uVar7 = uVar4 & 0x800000;
    iVar6 = iVar6 + (uVar7 >> 0x17);
    if (iVar6 < 0x10) {
      uVar5 = 0;
      if (uVar7 == 0) {
        uVar5 = (ushort)(uVar4 >> 0xd);
      }
      return (Float<unsigned_short,_5,_10,_15,_1U>)(uVar5 | uVar3 | (short)iVar6 * 0x400 + 0x3c00U);
    }
  }
  return (Float<unsigned_short,_5,_10,_15,_1U>)((ushort)(-1 < (int)uVar1) * -0x8000 - 0x400);
}

Assistant:

inline StorageType		exponentBits	(void) const	{ return (m_value >> MantissaBits) & ((StorageType(1)<<ExponentBits)-1);	}